

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O1

second_type
google::protobuf::
FindPtrOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
          (unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
           *collection,first_type *key)

{
  __node_ptr p_Var1;
  char *pcVar2;
  second_type pFVar3;
  ulong uVar4;
  char cVar5;
  
  pcVar2 = key->second;
  cVar5 = *pcVar2;
  if (cVar5 == '\0') {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pcVar2 = pcVar2 + 1;
      uVar4 = (long)cVar5 + uVar4 * 5;
      cVar5 = *pcVar2;
    } while (cVar5 != '\0');
  }
  uVar4 = (long)key->first * 0x1000193 ^ uVar4;
  pFVar3 = (second_type)0x0;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&collection->_M_h,uVar4 % (collection->_M_h)._M_bucket_count,key,uVar4);
  if (p_Var1 != (__node_ptr)0x0) {
    pFVar3 = *(second_type *)
              ((long)&(p_Var1->
                      super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>
                      ._M_storage._M_storage + 0x10);
  }
  return pFVar3;
}

Assistant:

typename Collection::value_type::second_type
FindPtrOrNull(Collection& collection,  // NOLINT
              const typename Collection::value_type::first_type& key) {
  typename Collection::iterator it = collection.find(key);
  if (it == collection.end()) {
    return typename Collection::value_type::second_type();
  }
  return it->second;
}